

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group.cxx
# Opt level: O0

void __thiscall Fl_Group::clear(Fl_Group *this)

{
  int iVar1;
  uint n;
  Fl_Widget **ppFVar2;
  Fl_Widget *pFVar3;
  Fl_Group *pFVar4;
  Fl_Widget *w;
  int local_30;
  int idx;
  int j;
  int i;
  Fl_Widget **a;
  Fl_Widget *temp;
  Fl_Widget *pushed;
  Fl_Group *this_local;
  
  this->savedfocus_ = (Fl_Widget *)0x0;
  this->resizable_ = &this->super_Fl_Widget;
  init_sizes(this);
  temp = Fl::pushed();
  iVar1 = Fl_Widget::contains(&this->super_Fl_Widget,temp);
  if (iVar1 != 0) {
    temp = &this->super_Fl_Widget;
  }
  Fl::pushed(&this->super_Fl_Widget);
  if (1 < this->children_) {
    ppFVar2 = array(this);
    idx = 0;
    local_30 = this->children_;
    for (; local_30 = local_30 + -1, idx < this->children_ / 2; idx = idx + 1) {
      pFVar3 = ppFVar2[idx];
      ppFVar2[idx] = ppFVar2[local_30];
      ppFVar2[local_30] = pFVar3;
    }
  }
  while (this->children_ != 0) {
    n = this->children_ - 1;
    pFVar3 = child(this,n);
    pFVar4 = Fl_Widget::parent(pFVar3);
    if (pFVar4 == this) {
      if (this->children_ < 3) {
        remove(this,(char *)(ulong)n);
      }
      else {
        pFVar3->parent_ = (Fl_Group *)0x0;
        this->children_ = this->children_ + -1;
      }
      if (pFVar3 != (Fl_Widget *)0x0) {
        (*pFVar3->_vptr_Fl_Widget[1])();
      }
    }
    else {
      remove(this,(char *)(ulong)n);
    }
  }
  if ((Fl_Group *)temp != this) {
    Fl::pushed(temp);
  }
  return;
}

Assistant:

void Fl_Group::clear() {
  savedfocus_ = 0;
  resizable_ = this;
  init_sizes();

  // we must change the Fl::pushed() widget, if it is one of
  // the group's children. Otherwise fl_fix_focus() would send
  // lots of events to children that are about to be deleted
  // anyway.

  Fl_Widget *pushed = Fl::pushed();	// save pushed() widget
  if (contains(pushed)) pushed = this;	// set it to be the group, if it's a child
  Fl::pushed(this);			// for fl_fix_focus etc.

  // okay, now it is safe to destroy the children:

#define REVERSE_CHILDREN
#ifdef  REVERSE_CHILDREN
  // Reverse the order of the children. Doing this and deleting
  // always the last child is much faster than the other way around.
  if (children_ > 1) {
    Fl_Widget *temp;
    Fl_Widget **a = (Fl_Widget**)array();
    for (int i=0,j=children_-1; i<children_/2; i++,j--) {
      temp = a[i];
      a[i] = a[j];
      a[j] = temp;
    }
  }
#endif // REVERSE_CHILDREN

  while (children_) {			// delete all children
    int idx = children_-1;		// last child's index
    Fl_Widget* w = child(idx);		// last child widget
    if (w->parent()==this) {		// should always be true
      if (children_>2) {		// optimized removal
        w->parent_ = 0;			// reset child's parent
        children_--;			// update counter
      } else {				// slow removal
        remove(idx);
      }
      delete w;				// delete the child
    } else {				// should never happen
      remove(idx);			// remove it anyway
    }
  }

  if (pushed != this) Fl::pushed(pushed); // reset pushed() widget

}